

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

int __thiscall OpenMD::EAMAdapter::getNr(EAMAdapter *this)

{
  FuncflParameters funcflParam;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 local_68;
  
  getFuncflParam((EAMAdapter *)funcflParam.dr);
  FuncflParameters::~FuncflParameters
            ((FuncflParameters *)CONCAT44(local_68,in_stack_ffffffffffffff70));
  return local_68;
}

Assistant:

int EAMAdapter::getNr() {
    FuncflParameters funcflParam = getFuncflParam();
    return funcflParam.nr;
  }